

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

CBString * __thiscall Bstrlib::CBStream::operator>>(CBStream *this,CBString *s)

{
  int iVar1;
  CBStringException *this_00;
  bstring local_88;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  CBStringException bstr__cppwrapper_exception;
  CBString *s_local;
  CBStream *this_local;
  
  bstr__cppwrapper_exception.msg.field_2._8_8_ = s;
  do {
    iVar1 = bseof(this->m_s);
    if (iVar1 != 0) {
      return (CBString *)bstr__cppwrapper_exception.msg.field_2._8_8_;
    }
    local_88 = (bstring)0x0;
    if (bstr__cppwrapper_exception.msg.field_2._8_8_ != 0) {
      local_88 = (bstring)(bstr__cppwrapper_exception.msg.field_2._8_8_ + 8);
    }
    iVar1 = bsreada(local_88,this->m_s,0x400);
  } while ((-1 < iVar1) || (iVar1 = eof(this), -1 < iVar1));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"CBString::Failed read",&local_61);
  CBStringException::CBStringException((CBStringException *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,(CBStringException *)local_40);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

CBString& CBStream::operator >> (CBString& s) {
	while (!bseof (m_s)) {
		if (0 > bsreada ((bstring) &s, m_s, BS_BUFF_SZ) && eof () < 0) {
			bstringThrow ("Failed read");
		}
	}
	return s;
}